

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test_prefix_sum(void)

{
  element_type *peVar1;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::CFGNode> body;
  shared_ptr<vmips::VirtReg> current;
  shared_ptr<vmips::VirtReg> acc;
  shared_ptr<vmips::VirtReg> updated;
  shared_ptr<vmips::VirtReg> added;
  shared_ptr<vmips::CFGNode> after;
  shared_ptr<vmips::VirtReg> zero;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> local_40;
  Function local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  zero.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  std::make_shared<vmips::Function,char_const(&)[4],int>((char (*) [4])&f,(int *)"sum");
  vmips::get_special((SpecialReg)&zero);
  vmips::Function::entry();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  current.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  vmips::Function::append<vmips::li,int>
            ((Function *)&acc,
             (int *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vmips::get_special((SpecialReg)&body);
  vmips::Function::append<vmips::move,std::shared_ptr<vmips::VirtReg>>
            ((Function *)&current,(shared_ptr<vmips::VirtReg> *)peVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&body.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vmips::Function::new_section();
  vmips::Function::new_section_branch<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&after,
             (shared_ptr<vmips::VirtReg> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::switch_to
            (f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&added,
             (shared_ptr<vmips::VirtReg> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&acc);
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&updated,
             (shared_ptr<vmips::VirtReg> *)
             f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int *)&current);
  vmips::Function::add_phi
            (f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (shared_ptr *)&acc);
  vmips::Function::add_phi
            (f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (shared_ptr *)&updated);
  vmips::Function::branch_existing<vmips::j>
            (local_30,(shared_ptr<vmips::CFGNode> *)
                      f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_28);
  vmips::Function::switch_to
            (f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&acc.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>);
  vmips::Function::assign_special(peVar1,2,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::color();
  vmips::Function::scan_overlap();
  vmips::Function::handle_alloca();
  vmips::Function::output
            ((ostream *)f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&updated.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&added.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&after.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&body.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&current.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&acc.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&zero.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_prefix_sum() {
    auto f  = std::make_shared<Function>("sum", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto acc = f->append<li>(0);
    auto current = f->append<move>(get_special(SpecialReg::a0));
    auto body = f->new_section();
    auto after = f->new_section_branch<beqz>(current);

    // loop body
    f->switch_to(body);
    auto added = f->append<add>(acc, current);
    auto updated = f->append<addi>(current, -1);
    f->add_phi(acc, added);
    f->add_phi(updated, current);
    f->branch_existing<j>(body);

    // loop tail
    f->switch_to(after);
    f->assign_special(SpecialReg::v0, acc);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    f->scan_overlap();
    f->handle_alloca();
    f->output(std::cout);
}